

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

void __thiscall Refal2::CFunctionBuilder::AddEndOfLeft(CFunctionBuilder *this)

{
  bool bVar1;
  CFunctionBuilder *this_local;
  
  if (((this->super_CVariablesBuilder).field_0x1aac & 1) == 0) {
    while (bVar1 = std::
                   stack<Refal2::CNode<Refal2::CUnit>_*,_std::deque<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>_>
                   ::empty(&this->balanceStack), ((bVar1 ^ 0xffU) & 1) != 0) {
      std::
      stack<Refal2::CNode<Refal2::CUnit>_*,_std::deque<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>_>
      ::pop(&this->balanceStack);
      error(this,EC_UnclosedLeftParenInLeftPart);
    }
    bVar1 = CErrorsHelper::HasErrors((CErrorsHelper *)this);
    if (bVar1) {
      CNodeList<Refal2::CUnit>::Empty(&(this->acc).super_CNodeList<Refal2::CUnit>);
    }
    else {
      CNodeList<Refal2::CUnit>::Move
                (&(this->acc).super_CNodeList<Refal2::CUnit>,
                 &(this->leftPart).super_CNodeList<Refal2::CUnit>);
    }
    (this->super_CVariablesBuilder).field_0x1aac = 1;
  }
  else {
    error(this,EC_ThereAreMultiplePartsSeparatorInRules);
  }
  return;
}

Assistant:

void CFunctionBuilder::AddEndOfLeft()
{
	if( isProcessRightPart ) {
		error( EC_ThereAreMultiplePartsSeparatorInRules );
	} else {
		while( !balanceStack.empty() ) {
			balanceStack.pop();
			error( EC_UnclosedLeftParenInLeftPart );
		}
		if( HasErrors() ) {
			acc.Empty();
		} else {
			acc.Move( leftPart );
		}
		isProcessRightPart = true;
	}
}